

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

string * __thiscall
es32cts::RobustBufferAccessBehavior::TexelFetchTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this)

{
  allocator<char> local_19;
  TexelFetchTest *local_18;
  TexelFetchTest *this_local;
  
  local_18 = this;
  this_local = (TexelFetchTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 320 es\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1);\n}\n\n",
             &local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getVertexShader()
{
	return std::string("#version 320 es\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = vec4(0, 0, 0, 1);\n"
					   "}\n"
					   "\n");
}